

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O0

void writeModelObjective(FILE *file,HighsLogOptions *log_options,HighsModel *model,
                        vector<double,_std::allocator<double>_> *primal_solution)

{
  vector<double,_std::allocator<double>_> *in_RDX;
  HighsHessian *in_RSI;
  double unaff_retaddr;
  HighsLogOptions *in_stack_00000008;
  FILE *in_stack_00000010;
  HighsCDouble objective_value;
  HighsCDouble *in_stack_ffffffffffffffa8;
  HighsCDouble *in_stack_ffffffffffffffb0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb8;
  HighsLp *in_stack_ffffffffffffffc0;
  HighsCDouble local_30;
  
  local_30 = HighsLp::objectiveCDoubleValue(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  HighsHessian::objectiveCDoubleValue(in_RSI,in_RDX);
  HighsCDouble::operator+=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  HighsCDouble::operator_cast_to_double(&local_30);
  writeObjectiveValue(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  return;
}

Assistant:

void writeModelObjective(FILE* file, const HighsLogOptions& log_options,
                         const HighsModel& model,
                         const std::vector<double>& primal_solution) {
  HighsCDouble objective_value =
      model.lp_.objectiveCDoubleValue(primal_solution);
  objective_value += model.hessian_.objectiveCDoubleValue(primal_solution);
  writeObjectiveValue(file, log_options, (double)objective_value);
}